

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O1

bool mg::data::mzx_decompress(string *compressed,string *out,bool invert)

{
  undefined8 uVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar12;
  ulong uVar14;
  int iVar15;
  byte bVar16;
  bool bVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  uint16_t auStack_c8 [4];
  uint16_t ring_buffer [64];
  ushort uVar11;
  ushort uVar13;
  ushort uVar17;
  
  if (compressed->_M_string_length < 8) {
    mzx_decompress();
    bVar18 = false;
  }
  else {
    uVar1 = *(undefined8 *)(compressed->_M_dataplus)._M_p;
    bVar18 = (int)uVar1 == 0x30585a4d;
    if (bVar18) {
      std::__cxx11::string::resize((ulong)out,(char)((ulong)uVar1 >> 0x20));
      bVar16 = -invert;
      uVar17 = (ushort)bVar16;
      auVar20 = pshuflw(ZEXT216(CONCAT11(bVar16,bVar16)),ZEXT216(CONCAT11(bVar16,bVar16)),0);
      uVar19 = auVar20._0_4_;
      ring_buffer[0x34] = (uint16_t)uVar19;
      ring_buffer[0x35] = SUB42(uVar19,2);
      ring_buffer[0x36] = (uint16_t)uVar19;
      ring_buffer[0x37] = SUB42(uVar19,2);
      ring_buffer[0x38] = (uint16_t)uVar19;
      ring_buffer[0x39] = SUB42(uVar19,2);
      ring_buffer[0x3a] = (uint16_t)uVar19;
      ring_buffer[0x3b] = SUB42(uVar19,2);
      ring_buffer[0x2c] = (uint16_t)uVar19;
      ring_buffer[0x2d] = SUB42(uVar19,2);
      ring_buffer[0x2e] = (uint16_t)uVar19;
      ring_buffer[0x2f] = SUB42(uVar19,2);
      ring_buffer[0x30] = (uint16_t)uVar19;
      ring_buffer[0x31] = SUB42(uVar19,2);
      ring_buffer[0x32] = (uint16_t)uVar19;
      ring_buffer[0x33] = SUB42(uVar19,2);
      ring_buffer[0x24] = (uint16_t)uVar19;
      ring_buffer[0x25] = SUB42(uVar19,2);
      ring_buffer[0x26] = (uint16_t)uVar19;
      ring_buffer[0x27] = SUB42(uVar19,2);
      ring_buffer[0x28] = (uint16_t)uVar19;
      ring_buffer[0x29] = SUB42(uVar19,2);
      ring_buffer[0x2a] = (uint16_t)uVar19;
      ring_buffer[0x2b] = SUB42(uVar19,2);
      ring_buffer[0x1c] = (uint16_t)uVar19;
      ring_buffer[0x1d] = SUB42(uVar19,2);
      ring_buffer[0x1e] = (uint16_t)uVar19;
      ring_buffer[0x1f] = SUB42(uVar19,2);
      ring_buffer[0x20] = (uint16_t)uVar19;
      ring_buffer[0x21] = SUB42(uVar19,2);
      ring_buffer[0x22] = (uint16_t)uVar19;
      ring_buffer[0x23] = SUB42(uVar19,2);
      ring_buffer[0x14] = (uint16_t)uVar19;
      ring_buffer[0x15] = SUB42(uVar19,2);
      ring_buffer[0x16] = (uint16_t)uVar19;
      ring_buffer[0x17] = SUB42(uVar19,2);
      ring_buffer[0x18] = (uint16_t)uVar19;
      ring_buffer[0x19] = SUB42(uVar19,2);
      ring_buffer[0x1a] = (uint16_t)uVar19;
      ring_buffer[0x1b] = SUB42(uVar19,2);
      ring_buffer[0xc] = (uint16_t)uVar19;
      ring_buffer[0xd] = SUB42(uVar19,2);
      ring_buffer[0xe] = (uint16_t)uVar19;
      ring_buffer[0xf] = SUB42(uVar19,2);
      ring_buffer[0x10] = (uint16_t)uVar19;
      ring_buffer[0x11] = SUB42(uVar19,2);
      ring_buffer[0x12] = (uint16_t)uVar19;
      ring_buffer[0x13] = SUB42(uVar19,2);
      ring_buffer[4] = (uint16_t)uVar19;
      ring_buffer[5] = SUB42(uVar19,2);
      ring_buffer[6] = (uint16_t)uVar19;
      ring_buffer[7] = SUB42(uVar19,2);
      ring_buffer[8] = (uint16_t)uVar19;
      ring_buffer[9] = SUB42(uVar19,2);
      ring_buffer[10] = (uint16_t)uVar19;
      ring_buffer[0xb] = SUB42(uVar19,2);
      auStack_c8[0] = (uint16_t)uVar19;
      auStack_c8[1] = SUB42(uVar19,2);
      auStack_c8[2] = (uint16_t)uVar19;
      auStack_c8[3] = SUB42(uVar19,2);
      ring_buffer[0] = (uint16_t)uVar19;
      ring_buffer[1] = SUB42(uVar19,2);
      ring_buffer[2] = (uint16_t)uVar19;
      ring_buffer[3] = SUB42(uVar19,2);
      if (8 < compressed->_M_string_length) {
        uVar7 = 8;
        uVar8 = 0;
        uVar9 = 0;
        bVar3 = false;
        uVar11 = uVar17;
        uVar13 = uVar17;
        do {
          uVar14 = uVar7 + 1;
          pcVar2 = (compressed->_M_dataplus)._M_p;
          bVar10 = pcVar2[uVar7];
          uVar6 = bVar10 & 3;
          bVar10 = bVar10 >> 2;
          bVar4 = bVar3;
          if (!bVar3) {
            bVar4 = true;
            uVar13 = uVar17;
          }
          uVar11 = uVar11 & 0xff;
          if (!bVar3) {
            uVar11 = uVar17;
          }
          switch(uVar6) {
          case 0:
            iVar15 = (bVar10 - uVar6) + 1;
            do {
              if (uVar9 < out->_M_string_length) {
                (out->_M_dataplus)._M_p[uVar9] = (char)uVar11;
                uVar9 = uVar9 + 1;
              }
              if (uVar9 < out->_M_string_length) {
                (out->_M_dataplus)._M_p[uVar9] = (char)uVar13;
                uVar9 = uVar9 + 1;
              }
              iVar15 = iVar15 + -1;
              uVar7 = uVar14;
            } while (iVar15 != 0);
            break;
          case 1:
            bVar12 = pcVar2[uVar14];
            iVar15 = bVar10 + 1;
            do {
              lVar5 = uVar9 - (uint)bVar12 * 2;
              pcVar2 = (out->_M_dataplus)._M_p;
              uVar11 = (ushort)(byte)pcVar2[lVar5 + -2];
              bVar10 = pcVar2[lVar5 + -1];
              uVar13 = (ushort)bVar10;
              if (uVar9 < out->_M_string_length) {
                pcVar2[uVar9] = pcVar2[lVar5 + -2];
                uVar9 = uVar9 + 1;
              }
              if (uVar9 < out->_M_string_length) {
                (out->_M_dataplus)._M_p[uVar9] = bVar10;
                uVar9 = uVar9 + 1;
              }
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            uVar7 = uVar7 + 2;
            break;
          case 2:
            uVar11 = auStack_c8[bVar10];
            if (uVar9 < out->_M_string_length) {
              (out->_M_dataplus)._M_p[uVar9] = (char)uVar11;
              uVar9 = uVar9 + 1;
            }
            uVar13 = uVar11 >> 8;
            uVar7 = uVar14;
            if (uVar9 < out->_M_string_length) {
              (out->_M_dataplus)._M_p[uVar9] = (char)(uVar11 >> 8);
              uVar9 = uVar9 + 1;
            }
            break;
          case 3:
            iVar15 = bVar10 + 1;
            do {
              pcVar2 = (compressed->_M_dataplus)._M_p;
              bVar10 = pcVar2[uVar14] ^ bVar16;
              uVar11 = (ushort)bVar10;
              bVar12 = pcVar2[uVar14 + 1] ^ bVar16;
              uVar13 = (ushort)bVar12;
              if (uVar9 < out->_M_string_length) {
                (out->_M_dataplus)._M_p[uVar9] = bVar10;
                uVar9 = uVar9 + 1;
              }
              if (uVar9 < out->_M_string_length) {
                (out->_M_dataplus)._M_p[uVar9] = bVar12;
                uVar9 = uVar9 + 1;
              }
              auStack_c8[uVar8] = CONCAT11(bVar12,bVar10);
              uVar8 = (ulong)((int)uVar8 + 1U & 0x3f);
              uVar14 = uVar14 + 2;
              iVar15 = iVar15 + -1;
              uVar7 = uVar14;
            } while (iVar15 != 0);
          }
          bVar3 = bVar4;
        } while (uVar7 < compressed->_M_string_length);
      }
    }
    else {
      mzx_decompress();
    }
  }
  return bVar18;
}

Assistant:

bool mzx_decompress(const std::string &compressed, std::string &out,
                    bool invert) {
  // If header is too small, bail immediately
  if (compressed.size() < sizeof(MzxHeader)) {
    fprintf(stderr, "Header too small\n");
    return false;
  }

  // Pun start of data stream into header
  MzxHeader header = *reinterpret_cast<const MzxHeader *>(compressed.data());
  header.to_host_order();

  // If the magic doesn't match, do not try and uncompress
  if (memcmp(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic)) != 0) {
    fprintf(stderr, "Invalid file magic\n");
    return false;
  }

  // Resize output buffer to accomodate decompressed data
  out.resize(header.decompressed_size);

  // Last written short
  uint8_t last[2];
  memset(last, invert ? 0xFF : 0x00, sizeof(last));

  // Ring buffer
  uint16_t ring_buffer[64];
  memset(ring_buffer, invert ? 0xFF : 0x00, sizeof(ring_buffer));

  // Clear counter. Last data is reinitialized on zero.
  int clear_count = 0;

  // Start reading right after the header
  std::string::size_type read_offset = sizeof(MzxHeader);
  std::string::size_type decompress_offset = 0;
  unsigned ring_buffer_write_offset = 0;
  while (read_offset < compressed.size()) {
    // Get type / len
    const uint8_t len_cmd = compressed[read_offset++];
    const unsigned cmd = len_cmd & 0b11;
    const unsigned len = len_cmd >> 2;

    // Reset counter
    if (clear_count <= 0) {
      clear_count = 0x1000;
      memset(last, invert ? 0xFF : 0x00, sizeof(last));
    }

    auto emit_byte = [&](uint8_t byte) {
      if (decompress_offset >= out.size()) {
        // fprintf(stderr, "Tried to write %d bytes past end of buffer: %02x\n",
        //         (int)decompress_offset - (int)out.size(), byte);
        return;
      }
      out[decompress_offset++] = byte;
    };

    switch (cmd) {

    case CMD_RLE: {
      // Repeat last two bytes len + 1 times
      for (unsigned i = 0; i <= len; i++) {
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_BACKREF: {
      const int lookback_distance =
          2 * (static_cast<uint8_t>(compressed[read_offset++]) + 1);
      for (unsigned i = 0; i <= len; i++) {
        const std::string::size_type lookback_offset =
            decompress_offset - lookback_distance;

        // Read 2 bytes into last buffer
        last[0] = out[lookback_offset];
        last[1] = out[lookback_offset + 1];

        // Write those bytes to end of stream
        emit_byte(last[0]);
        emit_byte(last[1]);
      }
    } break;

    case CMD_RINGBUF: {
      // Load ring buffer data at position len into last
      *reinterpret_cast<uint16_t *>(last) = ring_buffer[len];

      // Emit last
      emit_byte(last[0]);
      emit_byte(last[1]);
    } break;

    case CMD_LITERAL: {
      for (unsigned i = 0; i <= len; i++) {
        const uint8_t r0 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);
        const uint8_t r1 = compressed[read_offset++] ^ (invert ? 0xFF : 0x00);

        // Update last
        last[0] = r0;
        last[1] = r1;

        // Emit data
        emit_byte(last[0]);
        emit_byte(last[1]);

        // Write to ring buffer
        ring_buffer[ring_buffer_write_offset++] = (r1 << 8) | r0;
        ring_buffer_write_offset &= 0x3f;
      }
      break;
    }
    }
  }

  return true;
}